

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O0

void __thiscall
camera<double>::camera
          (camera<double> *this,point3<double> *from,point3<double> *to,vec3<double> *vup,
          double *fov,double *ar,double *ap,double *focus,double *t0,double *t1)

{
  double *in_RSI;
  vec3<double> *in_RDI;
  double *in_R8;
  double dVar1;
  double *in_stack_00000008;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double vp_width;
  double vp_height;
  double h;
  double t;
  double *in_stack_fffffffffffffe58;
  vec3<double> *in_stack_fffffffffffffe60;
  vec3<double> *in_stack_fffffffffffffe68;
  double *in_stack_fffffffffffffe70;
  double *t_00;
  vec3<double> *in_stack_fffffffffffffe78;
  vec3<double> *in_stack_fffffffffffffe80;
  vec3<double> *in_stack_fffffffffffffea8;
  vec3<double> *in_stack_fffffffffffffeb0;
  double local_120;
  double local_118;
  double local_110;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_98;
  double local_90;
  double local_88;
  double local_68;
  double local_60;
  double local_58;
  
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  vec3<double>::vec3(in_RDI);
  dVar1 = deg_to_rad(*in_R8);
  tan(dVar1 / 2.0);
  operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  unit_v<double>(in_stack_fffffffffffffe60);
  in_RDI[6].e[0] = local_68;
  in_RDI[6].e[1] = local_60;
  in_RDI[6].e[2] = local_58;
  cross<double>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  unit_v<double>(in_stack_fffffffffffffe60);
  in_RDI[4].e[0] = local_98;
  in_RDI[4].e[1] = local_90;
  in_RDI[4].e[2] = local_88;
  cross<double>(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  in_RDI[5].e[0] = local_c8;
  in_RDI[5].e[1] = local_c0;
  in_RDI[5].e[2] = local_b8;
  in_RDI[7].e[1] = *in_stack_00000018;
  in_RDI[7].e[2] = *in_stack_00000020;
  in_RDI->e[0] = *in_RSI;
  in_RDI->e[1] = in_RSI[1];
  in_RDI->e[2] = in_RSI[2];
  operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  in_RDI[2].e[0] = local_e0;
  in_RDI[2].e[1] = local_d8;
  in_RDI[2].e[2] = local_d0;
  operator*(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  in_RDI[3].e[0] = local_100;
  in_RDI[3].e[1] = local_f8;
  in_RDI[3].e[2] = local_f0;
  operator/(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  t_00 = (double *)0x4000000000000000;
  operator/(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  operator*(t_00,in_stack_fffffffffffffe68);
  operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  in_RDI[1].e[0] = local_120;
  in_RDI[1].e[1] = local_118;
  in_RDI[1].e[2] = local_110;
  in_RDI[7].e[0] = *in_stack_00000008 / 2.0;
  return;
}

Assistant:

camera(const point3<T>& from,
         const point3<T>& to,
         const vec3<T>& vup,
         const T& fov,
         const T& ar,
         const T& ap,
         const T& focus,
         const T& t0 = 0,
         const T& t1 = 0) {
    T t = deg_to_rad(fov);
    T h = std::tan(t / static_cast<T>(2));
    T vp_height = static_cast<T>(2.0) * h;
    T vp_width = ar * vp_height;
    // T focus = 1.0;

    w = unit_v<T>(from - to);
    u = unit_v<T>(cross<T>(vup, w));
    v = cross<T>(w, u);

    t0_ = t0;
    t1_ = t1;

    o_ = from;
    hor_ = focus * vp_width * u;
    ver_ = focus * vp_height * v;
    llc_ = o_ - hor_ / static_cast<T>(2.0) - ver_ / static_cast<T>(2.0) -
           focus * w;

    r_ = ap / static_cast<T>(2);
  }